

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

QString * __thiscall
QTextEdit::anchorAt(QString *__return_storage_ptr__,QTextEdit *this,QPoint *pos)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  LayoutDirection LVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  plVar3 = *(long **)(lVar2 + 0x2f8);
  LVar4 = QWidget::layoutDirection(*(QWidget **)(lVar2 + 8));
  if (LVar4 == RightToLeft) {
    QAbstractSlider::maximum(*(QAbstractSlider **)(lVar2 + 0x288));
    QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x288));
  }
  else {
    QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x288));
  }
  QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x290));
  (**(code **)(*plVar3 + 0x70))(__return_storage_ptr__,plVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextEdit::anchorAt(const QPoint& pos) const
{
    Q_D(const QTextEdit);
    return d->control->anchorAt(d->mapToContents(pos));
}